

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_nyi(jit_State *J,RecordFFData *rd)

{
  uint8_t uVar1;
  uint uVar2;
  BCOp op;
  RecordFFData *rd_local;
  jit_State *J_local;
  
  if (J->param[5] + 0x8000U <= (J->cur).nins) {
    if ((((((J->framedepth == 0) || ((J->L->base[-1].u64 & 3) != 0)) ||
          (uVar2 = *(uint *)J->L->base[-1] & 0xff, uVar2 == 0x41)) ||
         ((uVar2 == 0x43 || (uVar2 == 0x49)))) ||
        ((uVar2 == 0x3f || ((uVar1 = (J->fn->c).ffid, uVar1 == '\x13' || (uVar1 == 0x9e)))))) ||
       (uVar1 == 0xa4)) {
      lj_record_stop(J,LJ_TRLINK_RETURN,0);
      rd->nres = -1;
    }
    else {
      recff_stitch(J);
      rd->nres = -1;
    }
    return;
  }
  lj_trace_err_info(J,LJ_TRERR_TRACEUV);
}

Assistant:

static void LJ_FASTCALL recff_nyi(jit_State *J, RecordFFData *rd)
{
  if (J->cur.nins < (IRRef)J->param[JIT_P_minstitch] + REF_BASE) {
    lj_trace_err_info(J, LJ_TRERR_TRACEUV);
  } else {
    /* Can only stitch from Lua call. */
    if (J->framedepth && frame_islua(J->L->base-1)) {
      BCOp op = bc_op(*frame_pc(J->L->base-1));
      /* Stitched trace cannot start with *M op with variable # of args. */
      if (!(op == BC_CALLM || op == BC_CALLMT ||
	    op == BC_RETM || op == BC_TSETM)) {
	switch (J->fn->c.ffid) {
	case FF_error:
	case FF_debug_sethook:
	case FF_jit_flush:
	  break;  /* Don't stitch across special builtins. */
	default:
	  recff_stitch(J);  /* Use trace stitching. */
	  rd->nres = -1;
	  return;
	}
      }
    }
    /* Otherwise stop trace and return to interpreter. */
    lj_record_stop(J, LJ_TRLINK_RETURN, 0);
    rd->nres = -1;
  }
}